

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function.cpp
# Opt level: O3

void __thiscall
duckdb::ScalarFunction::ScalarFunction
          (ScalarFunction *this,string *name,vector<duckdb::LogicalType,_true> *arguments,
          LogicalType *return_type,scalar_function_t *function,bind_scalar_function_t bind,
          bind_scalar_function_extended_t bind_extended,function_statistics_t statistics,
          init_local_state_t init_local_state,LogicalType varargs,FunctionStability side_effects,
          FunctionNullHandling null_handling,bind_lambda_function_t bind_lambda)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  undefined7 in_stack_00000039;
  string local_98;
  pointer local_78;
  pointer pLStack_70;
  pointer local_68;
  LogicalType local_60;
  LogicalType local_48;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if (paVar2 == paVar1) {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98._M_dataplus._M_p = (pointer)paVar2;
  }
  local_98._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  local_78 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
  pLStack_70 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
  local_68 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LogicalType::LogicalType(&local_48,return_type);
  LogicalType::LogicalType(&local_60,(LogicalType *)varargs._0_8_);
  BaseScalarFunction::BaseScalarFunction
            (&this->super_BaseScalarFunction,&local_98,
             (vector<duckdb::LogicalType,_true> *)&local_78,&local_48,
             (FunctionStability)
             varargs.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_60,
             (FunctionNullHandling)
             varargs.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             ,CANNOT_ERROR);
  LogicalType::~LogicalType(&local_60);
  LogicalType::~LogicalType(&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  (this->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  *(undefined8 *)&(this->function).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->function).super__Function_base._M_functor + 8) = 0;
  (this->function).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->function)._M_invoker = function->_M_invoker;
  if ((function->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(function->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->function).super__Function_base._M_functor =
         *(undefined8 *)&(function->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->function).super__Function_base._M_functor + 8) = uVar3;
    (this->function).super__Function_base._M_manager = (function->super__Function_base)._M_manager;
    (function->super__Function_base)._M_manager = (_Manager_type)0x0;
    function->_M_invoker = (_Invoker_type)0x0;
  }
  this->bind = bind;
  this->bind_extended = bind_extended;
  this->init_local_state = init_local_state;
  this->statistics = statistics;
  this->bind_lambda = (bind_lambda_function_t)CONCAT71(in_stack_00000039,side_effects);
  this->bind_expression = (function_bind_expression_t)0x0;
  this->get_modified_databases = (get_modified_databases_t)0x0;
  this->serialize = (function_serialize_t)0x0;
  this->deserialize = (function_deserialize_t)0x0;
  (this->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

ScalarFunction::ScalarFunction(string name, vector<LogicalType> arguments, LogicalType return_type,
                               scalar_function_t function, bind_scalar_function_t bind,
                               bind_scalar_function_extended_t bind_extended, function_statistics_t statistics,
                               init_local_state_t init_local_state, LogicalType varargs, FunctionStability side_effects,
                               FunctionNullHandling null_handling, bind_lambda_function_t bind_lambda)
    : BaseScalarFunction(std::move(name), std::move(arguments), std::move(return_type), side_effects,
                         std::move(varargs), null_handling),
      function(std::move(function)), bind(bind), bind_extended(bind_extended), init_local_state(init_local_state),
      statistics(statistics), bind_lambda(bind_lambda), bind_expression(nullptr), get_modified_databases(nullptr),
      serialize(nullptr), deserialize(nullptr) {
}